

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O1

void amrex::Divide<amrex::IArrayBox,void>
               (FabArray<amrex::IArrayBox> *dst,FabArray<amrex::IArrayBox> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  Array4<int> dstFab;
  Array4<const_int> srcFab;
  MFIter mfi;
  Box local_1b4;
  ulong local_198;
  int local_18c;
  IntVect *local_188;
  FabArray<amrex::IArrayBox> *local_180;
  FabArray<amrex::IArrayBox> *local_178;
  long local_170;
  long local_168;
  ulong local_160;
  long local_158;
  long local_150;
  ulong local_148;
  long local_140;
  long local_138;
  int *local_130;
  long local_128;
  long local_120;
  int *local_118;
  Array4<int> local_110;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  local_180 = dst;
  local_178 = src;
  MFIter::MFIter(&local_90,&dst->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_168 = (long)srccomp;
    local_170 = (long)dstcomp;
    local_160 = (ulong)(uint)numcomp;
    local_188 = nghost;
    do {
      MFIter::growntilebox(&local_1b4,&local_90,nghost);
      if ((((local_1b4.smallend.vect[0] <= local_1b4.bigend.vect[0]) &&
           (local_1b4.smallend.vect[1] <= local_1b4.bigend.vect[1])) &&
          (local_1b4.smallend.vect[2] <= local_1b4.bigend.vect[2])) && (local_1b4.btype.itype < 8))
      {
        FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>(&local_d0,local_178,&local_90);
        FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>(&local_110,local_180,&local_90);
        nghost = local_188;
        if (0 < numcomp) {
          local_18c = local_1b4.smallend.vect[0];
          local_148 = (ulong)(uint)local_1b4.bigend.vect[0];
          local_198 = 0;
          do {
            if (local_1b4.smallend.vect[2] <= local_1b4.bigend.vect[2]) {
              local_150 = local_168 + local_198;
              local_158 = local_170 + local_198;
              iVar5 = local_1b4.smallend.vect[2];
              do {
                if (local_1b4.smallend.vect[1] <= local_1b4.bigend.vect[1]) {
                  local_118 = local_d0.p;
                  local_120 = local_d0.jstride;
                  local_128 = local_d0.kstride;
                  local_130 = local_110.p;
                  local_138 = local_110.jstride;
                  local_140 = local_110.kstride;
                  iVar3 = local_1b4.smallend.vect[1];
                  do {
                    iVar1 = local_1b4.smallend.vect[0];
                    if (local_1b4.smallend.vect[0] <= local_1b4.bigend.vect[0]) {
                      do {
                        lVar4 = ((long)iVar3 - (long)local_110.begin.y) * local_110.jstride;
                        lVar2 = ((long)iVar5 - (long)local_110.begin.z) * local_110.kstride;
                        local_110.p
                        [lVar4 + (long)(iVar1 - local_110.begin.x) +
                                 lVar2 + local_110.nstride * local_158] =
                             local_110.p
                             [lVar4 + (long)(iVar1 - local_110.begin.x) +
                                      lVar2 + local_110.nstride * local_158] /
                             local_d0.p
                             [((long)iVar3 - (long)local_d0.begin.y) * local_d0.jstride +
                              (long)(iVar1 - local_d0.begin.x) +
                              ((long)iVar5 - (long)local_d0.begin.z) * local_d0.kstride +
                              local_d0.nstride * local_150];
                        iVar1 = iVar1 + 1;
                      } while (local_1b4.bigend.vect[0] + 1U != iVar1);
                    }
                    bVar6 = iVar3 != local_1b4.bigend.vect[1];
                    iVar3 = iVar3 + 1;
                  } while (bVar6);
                }
                bVar6 = iVar5 != local_1b4.bigend.vect[2];
                iVar5 = iVar5 + 1;
              } while (bVar6);
            }
            local_198 = local_198 + 1;
          } while (local_198 != local_160);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
Divide (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) /= srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) /= srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}